

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deAppendList.hpp
# Opt level: O3

void __thiscall
de::AppendList<vk::AllocationCallbackRecord>::~AppendList
          (AppendList<vk::AllocationCallbackRecord> *this)

{
  Block *pBVar1;
  ulong uVar2;
  ulong uVar3;
  Block *pBVar4;
  ulong uVar5;
  
  if (this->m_first != (Block *)0x0) {
    uVar5 = 0;
    pBVar4 = this->m_first;
    do {
      pBVar1 = pBVar4->next;
      uVar2 = (pBVar4->blockNdx + 1) * this->m_blockSize;
      uVar5 = uVar5 - 1;
      do {
        uVar3 = this->m_numElements;
        if (uVar2 <= this->m_numElements) {
          uVar3 = uVar2;
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < uVar3);
      deAlignedFree(pBVar4->elements);
      operator_delete(pBVar4,0x18);
      pBVar4 = pBVar1;
    } while (pBVar1 != (Block *)0x0);
  }
  return;
}

Assistant:

AppendList<ElementType>::~AppendList (void)
{
	size_t	elementNdx	= 0;
	Block*	curBlock	= m_first;

	while (curBlock)
	{
		Block* const	delBlock	= curBlock;

		curBlock = delBlock->next;

		// Call destructor for allocated elements
		for (; elementNdx < min(m_numElements, (delBlock->blockNdx+1)*m_blockSize); ++elementNdx)
			delBlock->elements[elementNdx%m_blockSize].~ElementType();

		delete delBlock;
	}

	DE_ASSERT(elementNdx == m_numElements);
}